

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWritePla.c
# Opt level: O2

int Io_WritePlaOne(FILE *pFile,Abc_Ntk_t *pNtk)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  Abc_Obj_t *pAVar4;
  void *__s;
  void *__s_00;
  char *pcVar5;
  ProgressBar *p;
  Abc_Obj_t *pNode;
  size_t __n;
  long lVar6;
  int iVar7;
  size_t __n_00;
  long lVar8;
  anon_union_8_4_617c9805_for_Abc_Obj_t__17 aVar9;
  int iVar10;
  
  iVar10 = 0;
  iVar7 = 0;
  while( true ) {
    uVar3 = pNtk->vCos->nSize;
    __n_00 = (size_t)(int)uVar3;
    if ((int)uVar3 <= iVar10) break;
    pAVar4 = Abc_NtkCo(pNtk,iVar10);
    pAVar4 = Abc_ObjFanin0Ntk((Abc_Obj_t *)pAVar4->pNtk->vObjs->pArray[*(pAVar4->vFanins).pArray]);
    uVar3 = 1;
    if ((*(uint *)&pAVar4->field_0x14 & 0xf) == 7) {
      iVar2 = Abc_NodeIsConst(pAVar4);
      if (iVar2 == 0) {
        uVar3 = Abc_SopGetCubeNum((char *)(pAVar4->field_5).pData);
      }
      else {
        iVar2 = Abc_NodeIsConst1(pAVar4);
        uVar3 = (uint)(iVar2 != 0);
      }
    }
    iVar7 = iVar7 + uVar3;
    iVar10 = iVar10 + 1;
  }
  uVar1 = pNtk->vCis->nSize;
  __n = (size_t)(int)uVar1;
  __s = malloc(__n + 1);
  __s_00 = malloc(__n_00 + 1);
  memset(__s,0x2d,__n);
  *(undefined1 *)((long)__s + __n) = 0;
  memset(__s_00,0x30,__n_00);
  *(undefined1 *)((long)__s_00 + __n_00) = 0;
  fprintf((FILE *)pFile,".i %d\n",(ulong)uVar1);
  fprintf((FILE *)pFile,".o %d\n",(ulong)uVar3);
  fwrite(".ilb",4,1,(FILE *)pFile);
  for (iVar10 = 0; iVar10 < pNtk->vCis->nSize; iVar10 = iVar10 + 1) {
    pAVar4 = Abc_NtkCi(pNtk,iVar10);
    pcVar5 = Abc_ObjName((Abc_Obj_t *)pAVar4->pNtk->vObjs->pArray[*(pAVar4->vFanouts).pArray]);
    fprintf((FILE *)pFile," %s",pcVar5);
  }
  fputc(10,(FILE *)pFile);
  fwrite(".ob",3,1,(FILE *)pFile);
  for (iVar10 = 0; iVar10 < pNtk->vCos->nSize; iVar10 = iVar10 + 1) {
    pAVar4 = Abc_NtkCo(pNtk,iVar10);
    pcVar5 = Abc_ObjName((Abc_Obj_t *)pAVar4->pNtk->vObjs->pArray[*(pAVar4->vFanins).pArray]);
    fprintf((FILE *)pFile," %s",pcVar5);
  }
  fputc(10,(FILE *)pFile);
  fprintf((FILE *)pFile,".p %d\n",iVar7);
  for (aVar9.pTemp = (void *)0x0; (long)aVar9.pTemp < (long)pNtk->vCis->nSize;
      aVar9.pTemp = (void *)((long)&(aVar9.pCopy)->pNtk + 1)) {
    pAVar4 = Abc_NtkCi(pNtk,aVar9.iTemp);
    pAVar4->field_6 = aVar9;
  }
  p = Extra_ProgressBarStart(_stdout,uVar3);
  lVar6 = 0;
  do {
    if (pNtk->vCos->nSize <= lVar6) {
      Extra_ProgressBarStop(p);
      fwrite(".e\n",3,1,(FILE *)pFile);
      for (iVar7 = 0; iVar7 < pNtk->vCis->nSize; iVar7 = iVar7 + 1) {
        pAVar4 = Abc_NtkCi(pNtk,iVar7);
        (pAVar4->field_6).pTemp = (void *)0x0;
      }
      free(__s);
      free(__s_00);
      return 1;
    }
    pAVar4 = Abc_NtkCo(pNtk,(int)lVar6);
    if (lVar6 != 0) {
      *(undefined1 *)((long)__s_00 + lVar6 + -1) = 0x30;
    }
    *(undefined1 *)((long)__s_00 + lVar6) = 0x31;
    pNode = Abc_ObjFanin0Ntk((Abc_Obj_t *)pAVar4->pNtk->vObjs->pArray[*(pAVar4->vFanins).pArray]);
    uVar3 = *(uint *)&pNode->field_0x14 & 0xf;
    if ((uVar3 == 2) || (uVar3 == 5)) {
      *(char *)((long)__s + (long)(pNode->field_6).iTemp) =
           (char)((*(int *)&pAVar4->field_0x14 << 0x15) >> 0x1f) + '1';
      fprintf((FILE *)pFile,"%s %s\n",__s,__s_00);
      *(undefined1 *)((long)__s + (long)(pNode->field_6).iTemp) = 0x2d;
    }
    else {
      if (uVar3 != 7) {
        pcVar5 = "Abc_ObjIsCi(pDriver)";
        uVar3 = 0x70;
LAB_002a8e7f:
        __assert_fail(pcVar5,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/io/ioWritePla.c"
                      ,uVar3,"int Io_WritePlaOne(FILE *, Abc_Ntk_t *)");
      }
      iVar7 = Abc_NodeIsConst(pNode);
      if (iVar7 == 0) {
        iVar7 = Abc_SopIsComplement((char *)(pNode->field_5).pData);
        if (iVar7 != 0) {
          pcVar5 = "!Abc_SopIsComplement( (char *)pDriver->pData )";
          uVar3 = 0x7e;
          goto LAB_002a8e7f;
        }
        iVar7 = (pNode->vFanins).nSize;
        for (pcVar5 = (char *)(pNode->field_5).pData; *pcVar5 != '\0';
            pcVar5 = pcVar5 + (long)iVar7 + 3) {
          for (lVar8 = 0; lVar8 < (pNode->vFanins).nSize; lVar8 = lVar8 + 1) {
            pAVar4 = Abc_ObjFanin0Ntk((Abc_Obj_t *)
                                      pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[lVar8]]);
            iVar10 = (pAVar4->field_6).iTemp;
            if ((int)uVar1 <= iVar10) {
              __assert_fail("(int)(ABC_PTRUINT_T)pFanin->pCopy < nInputs",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/io/ioWritePla.c"
                            ,0x87,"int Io_WritePlaOne(FILE *, Abc_Ntk_t *)");
            }
            *(char *)((long)__s + (long)iVar10) = pcVar5[lVar8];
          }
          fprintf((FILE *)pFile,"%s %s\n",__s,__s_00);
        }
        for (lVar8 = 0; lVar8 < (pNode->vFanins).nSize; lVar8 = lVar8 + 1) {
          pAVar4 = Abc_ObjFanin0Ntk((Abc_Obj_t *)
                                    pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[lVar8]]);
          uVar3 = *(uint *)&pAVar4->field_0x14 & 0xf;
          if ((uVar3 != 2) && (uVar3 != 5)) {
            __assert_fail("Abc_ObjIsCi(pFanin)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/io/ioWritePla.c"
                          ,0x90,"int Io_WritePlaOne(FILE *, Abc_Ntk_t *)");
          }
          *(undefined1 *)((long)__s + (long)(pAVar4->field_6).iTemp) = 0x2d;
        }
        if ((p == (ProgressBar *)0x0) || (p->nItemsNext <= lVar6)) {
          Extra_ProgressBarUpdate_int(p,(int)lVar6,(char *)0x0);
        }
      }
      else {
        iVar7 = Abc_NodeIsConst1(pNode);
        if (iVar7 != 0) {
          fprintf((FILE *)pFile,"%s %s\n",__s,__s_00);
        }
      }
    }
    lVar6 = lVar6 + 1;
  } while( true );
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Writes the network in PLA format.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Io_WritePlaOne( FILE * pFile, Abc_Ntk_t * pNtk )
{
    ProgressBar * pProgress;
    Abc_Obj_t * pNode, * pFanin, * pDriver;
    char * pCubeIn, * pCubeOut, * pCube;
    int i, k, nProducts, nInputs, nOutputs, nFanins;

    nProducts = 0;
    Abc_NtkForEachCo( pNtk, pNode, i )
    {
        pDriver = Abc_ObjFanin0Ntk( Abc_ObjFanin0(pNode) );
        if ( !Abc_ObjIsNode(pDriver) )
        {
            nProducts++;
            continue;
        }
        if ( Abc_NodeIsConst(pDriver) )
        {
            if ( Abc_NodeIsConst1(pDriver) )
                nProducts++;
            continue;
        }
        nProducts += Abc_SopGetCubeNum((char *)pDriver->pData);
    }

    // collect the parameters
    nInputs  = Abc_NtkCiNum(pNtk);
    nOutputs = Abc_NtkCoNum(pNtk);
    pCubeIn  = ABC_ALLOC( char, nInputs + 1 );
    pCubeOut = ABC_ALLOC( char, nOutputs + 1 );
    memset( pCubeIn,  '-', nInputs );     pCubeIn[nInputs]   = 0;
    memset( pCubeOut, '0', nOutputs );    pCubeOut[nOutputs] = 0;

    // write the header
    fprintf( pFile, ".i %d\n", nInputs );
    fprintf( pFile, ".o %d\n", nOutputs );
    fprintf( pFile, ".ilb" );
    Abc_NtkForEachCi( pNtk, pNode, i )
        fprintf( pFile, " %s", Abc_ObjName(Abc_ObjFanout0(pNode)) );
    fprintf( pFile, "\n" );
    fprintf( pFile, ".ob" );
    Abc_NtkForEachCo( pNtk, pNode, i )
        fprintf( pFile, " %s", Abc_ObjName(Abc_ObjFanin0(pNode)) );
    fprintf( pFile, "\n" );
    fprintf( pFile, ".p %d\n", nProducts );

    // mark the CI nodes
    Abc_NtkForEachCi( pNtk, pNode, i )
        pNode->pCopy = (Abc_Obj_t *)(ABC_PTRUINT_T)i;

    // write the cubes
    pProgress = Extra_ProgressBarStart( stdout, nOutputs );
    Abc_NtkForEachCo( pNtk, pNode, i )
    {
        // prepare the output cube
        if ( i - 1 >= 0 )
            pCubeOut[i-1] = '0';
        pCubeOut[i] = '1';

        // consider special cases of nodes
        pDriver = Abc_ObjFanin0Ntk( Abc_ObjFanin0(pNode) );
        if ( !Abc_ObjIsNode(pDriver) )
        {
            assert( Abc_ObjIsCi(pDriver) );
            pCubeIn[(int)(ABC_PTRUINT_T)pDriver->pCopy] = '1' - Abc_ObjFaninC0(pNode);
            fprintf( pFile, "%s %s\n", pCubeIn, pCubeOut );
            pCubeIn[(int)(ABC_PTRUINT_T)pDriver->pCopy] = '-';
            continue;
        }
        if ( Abc_NodeIsConst(pDriver) )
        {
            if ( Abc_NodeIsConst1(pDriver) )
                fprintf( pFile, "%s %s\n", pCubeIn, pCubeOut );
            continue;
        }

        // make sure the cover is not complemented
        assert( !Abc_SopIsComplement( (char *)pDriver->pData ) );

        // write the cubes
        nFanins = Abc_ObjFaninNum(pDriver);
        Abc_SopForEachCube( (char *)pDriver->pData, nFanins, pCube )
        {
            Abc_ObjForEachFanin( pDriver, pFanin, k )
            {
                pFanin = Abc_ObjFanin0Ntk(pFanin);
                assert( (int)(ABC_PTRUINT_T)pFanin->pCopy < nInputs );
                pCubeIn[(int)(ABC_PTRUINT_T)pFanin->pCopy] = pCube[k];
            }
            fprintf( pFile, "%s %s\n", pCubeIn, pCubeOut );
        }
        // clean the cube for future writing
        Abc_ObjForEachFanin( pDriver, pFanin, k )
        {
            pFanin = Abc_ObjFanin0Ntk(pFanin);
            assert( Abc_ObjIsCi(pFanin) );
            pCubeIn[(int)(ABC_PTRUINT_T)pFanin->pCopy] = '-';
        }
        Extra_ProgressBarUpdate( pProgress, i, NULL );
    }
    Extra_ProgressBarStop( pProgress );
    fprintf( pFile, ".e\n" );

    // clean the CI nodes
    Abc_NtkForEachCi( pNtk, pNode, i )
        pNode->pCopy = NULL;
    ABC_FREE( pCubeIn );
    ABC_FREE( pCubeOut );
    return 1;
}